

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  cmCTest *this_00;
  char *pcVar1;
  _Alloc_hider _Var2;
  cmXMLWriter *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  pointer pcVar8;
  pointer pcVar9;
  int iVar10;
  string *path;
  string srcdir;
  string local_a8;
  byte local_81;
  cmCTestBuildHandler *local_80;
  int local_78;
  int local_74;
  pointer local_70;
  string local_68;
  cmXMLWriter *local_48;
  string *local_40;
  string *local_38;
  
  iVar5 = this->MaxErrors;
  iVar10 = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_80 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_68,this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::CollapseFullPath(&local_a8,&local_68);
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)&local_68);
  pcVar9 = (local_80->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = xml;
  if (pcVar9 != (local_80->ErrorsAndWarnings).
                super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_48 = pcVar3;
      if (iVar5 == 0 && iVar10 == 0) break;
      iVar6 = iVar10;
      if (pcVar9->Error != false) {
        iVar6 = iVar5;
      }
      if (iVar6 != 0) {
        iVar6 = 0x535f81;
        if (pcVar9->Error != false) {
          iVar6 = 0x5462ee;
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_81 = pcVar9->Error;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,iVar6,iVar6 + (pcVar9->Error ^ 1) * 2 + 5);
        cmXMLWriter::StartElement(xml,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"BuildLogLine","");
        cmXMLWriter::Element<int>(xml,&local_a8,&pcVar9->LogLine);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Text","");
        cmXMLWriter::StartElement(xml,&local_a8);
        local_38 = &pcVar9->Text;
        cmXMLWriter::Content<std::__cxx11::string>(xml,local_38);
        cmXMLWriter::EndElement(xml);
        local_78 = iVar5;
        local_74 = iVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        pcVar8 = (local_80->ErrorWarningFileLineRegex).
                 super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (local_80->ErrorWarningFileLineRegex).
                   super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar8 != local_70) {
          local_40 = &pcVar9->SourceFile;
          path = local_40;
          do {
            while (bVar4 = cmsys::RegularExpression::find
                                     (&pcVar8->RegularExpression,(local_38->_M_dataplus)._M_p,
                                      &(pcVar8->RegularExpression).regmatch), bVar4) {
              pcVar1 = (pcVar8->RegularExpression).regmatch.startp[pcVar8->FileIndex];
              if (pcVar1 == (char *)0x0) {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                local_a8._M_string_length = 0;
                local_a8.field_2._M_local_buf[0] = '\0';
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,pcVar1,
                           (pcVar8->RegularExpression).regmatch.endp[pcVar8->FileIndex]);
              }
              std::__cxx11::string::operator=((string *)path,(string *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,
                                CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                         local_a8.field_2._M_local_buf[0]) + 1);
              }
              cmsys::SystemTools::ConvertToUnixSlashes(path);
              lVar7 = std::__cxx11::string::find((char *)path,0x5354c4,0);
              if (lVar7 == -1) {
                cmsys::SystemTools::CollapseFullPath(&local_a8,path);
                std::__cxx11::string::operator=((string *)path,(string *)&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                           local_a8.field_2._M_local_buf[0]) + 1);
                }
                cmsys::SystemTools::ReplaceString(path,local_68._M_dataplus._M_p,"");
              }
              else {
                cmsys::SystemTools::ReplaceString(path,"/.../","");
                lVar7 = std::__cxx11::string::find((char)path,0x2f);
                if (lVar7 != -1) {
                  std::__cxx11::string::substr((ulong)&local_a8,(ulong)path);
                  std::__cxx11::string::operator=((string *)path,(string *)&local_a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                             local_a8.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
              pcVar1 = (pcVar8->RegularExpression).regmatch.startp[pcVar8->LineIndex];
              if (pcVar1 == (char *)0x0) {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                local_a8._M_string_length = 0;
                local_a8.field_2._M_local_buf[0] = '\0';
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,pcVar1,
                           (pcVar8->RegularExpression).regmatch.endp[pcVar8->LineIndex]);
              }
              _Var2._M_p = local_a8._M_dataplus._M_p;
              iVar5 = atoi(local_a8._M_dataplus._M_p);
              pcVar9->LineNumber = iVar5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var2._M_p != &local_a8.field_2) {
                operator_delete(_Var2._M_p,
                                CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                         local_a8.field_2._M_local_buf[0]) + 1);
              }
              pcVar8 = pcVar8 + 1;
              path = local_40;
              if (bVar4 || pcVar8 == local_70) goto LAB_001643f5;
            }
            pcVar8 = pcVar8 + 1;
          } while (pcVar8 != local_70);
        }
LAB_001643f5:
        xml = local_48;
        if (((pcVar9->SourceFile)._M_string_length != 0) && (-1 < pcVar9->LineNumber)) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SourceFile","");
          cmXMLWriter::StartElement(xml,&local_a8);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar9->SourceFile);
          cmXMLWriter::EndElement(xml);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          if ((pcVar9->SourceFileTail)._M_string_length != 0) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SourceFileTail","")
            ;
            cmXMLWriter::StartElement(xml,&local_a8);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar9->SourceFileTail);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
          }
          if (-1 < pcVar9->LineNumber) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"SourceLineNumber","");
            cmXMLWriter::Element<int>(xml,&local_a8,&pcVar9->LineNumber);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"PreContext","");
        cmXMLWriter::StartElement(xml,&local_a8);
        iVar10 = local_74;
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar9->PreContext);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"PostContext","");
        cmXMLWriter::StartElement(xml,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar9->PostContext);
        iVar10 = iVar10 - (uint)(local_81 ^ 1);
        iVar5 = local_78 - (uint)local_81;
        iVar6 = iVar10;
        if (pcVar9->Error != false) {
          iVar6 = iVar5;
        }
        if (iVar6 == 0) {
          cmXMLWriter::Content<char[72]>
                    (xml,(char (*) [72])
                         "\nThe maximum number of reported warnings or errors has been reached!!!\n"
                    );
        }
        cmXMLWriter::EndElement(xml);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"RepeatCount","");
        cmXMLWriter::StartElement(xml,&local_a8);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x5916ee);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
      }
      pcVar9 = pcVar9 + 1;
      pcVar3 = local_48;
    } while (pcVar9 != (local_80->ErrorsAndWarnings).
                       super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmSystemTools::CollapseFullPath(srcdir);
  srcdir += "/";
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}